

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void BM_Check1(int n)

{
  int iVar1;
  int iVar2;
  CheckOpString local_120;
  LogMessage local_118;
  string *local_108;
  _Check_string *_result_7;
  LogMessage local_f8;
  string *local_e8;
  _Check_string *_result_6;
  LogMessage local_d8;
  string *local_c8;
  _Check_string *_result_5;
  LogMessage local_b8;
  string *local_a8;
  _Check_string *_result_4;
  LogMessage local_98;
  string *local_88;
  _Check_string *_result_3;
  LogMessage local_78;
  string *local_68;
  _Check_string *_result_2;
  LogMessage local_58;
  string *local_48;
  _Check_string *_result_1;
  CheckOpString local_30;
  LogMessage local_28;
  string *local_18;
  _Check_string *_result;
  int n_local;
  
  _result._4_4_ = n;
  while( true ) {
    iVar2 = _result._4_4_ + -1;
    if (_result._4_4_ < 1) {
      return;
    }
    _result._4_4_ = iVar2;
    iVar2 = google::GetReferenceableValue(iVar2);
    iVar1 = google::GetReferenceableValue(x);
    local_18 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_18 != (string *)0x0) {
      google::CheckOpString::CheckOpString(&local_30,local_18);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x73,&local_30);
      google::LogMessage::stream(&local_28);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_48 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_48 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_2,local_48);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x74,(CheckOpString *)&_result_2);
      google::LogMessage::stream(&local_58);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_68 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_68 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_3,local_68);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x75,(CheckOpString *)&_result_3);
      google::LogMessage::stream(&local_78);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_88 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_88 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_4,local_88);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x76,(CheckOpString *)&_result_4);
      google::LogMessage::stream(&local_98);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_98);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_a8 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_a8 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_5,local_a8);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x77,(CheckOpString *)&_result_5);
      google::LogMessage::stream(&local_b8);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b8);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_c8 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_c8 != (string *)0x0) {
      google::CheckOpString::CheckOpString((CheckOpString *)&_result_6,local_c8);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x78,(CheckOpString *)&_result_6);
      google::LogMessage::stream(&local_d8);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d8);
    }
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_e8 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_e8 != (string *)0x0) break;
    iVar2 = google::GetReferenceableValue(_result._4_4_);
    iVar1 = google::GetReferenceableValue(x);
    local_108 = google::Check_GEImpl_abi_cxx11_(iVar2,iVar1,"n >= x");
    if (local_108 != (string *)0x0) {
      google::CheckOpString::CheckOpString(&local_120,local_108);
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x7a,&local_120);
      google::LogMessage::stream(&local_118);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_118);
    }
    local_108 = (string *)0x0;
  }
  google::CheckOpString::CheckOpString((CheckOpString *)&_result_7,local_e8);
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x79,(CheckOpString *)&_result_7);
  google::LogMessage::stream(&local_f8);
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f8);
}

Assistant:

static void BM_Check1(int n) {
  while (n-- > 0) {
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
  }
}